

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> * __thiscall
kj::Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::operator=
          (Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  if ((this->ptr).isSet == true) {
    (this->ptr).isSet = false;
    Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&(this->ptr).field_1.value);
  }
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }